

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

void namedVariable(Token name,_Bool canAssign)

{
  byte bVar1;
  uint8_t byte1;
  uint uVar2;
  ObjString *pOVar3;
  uint8_t uVar4;
  
  uVar2 = resolveLocal(current,&name);
  if (uVar2 == 0xffffffff) {
    uVar2 = resolveUpvalue(current,&name);
    if (uVar2 == 0xffffffff) {
      pOVar3 = copyString(name.start,name.length);
      bVar1 = makeConstant((ulong)pOVar3 | 0xfffc000000000000);
      uVar2 = (uint)bVar1;
      uVar4 = '\t';
      byte1 = '\x06';
    }
    else {
      uVar4 = '\v';
      byte1 = '\n';
    }
  }
  else {
    uVar4 = '\b';
    byte1 = '\x05';
  }
  if ((canAssign) && (parser.current.type == TOKEN_EQUAL)) {
    advance();
    parsePrecedence(PREC_ASSIGNMENT);
    byte1 = uVar4;
  }
  emitBytes(byte1,(uint8_t)uVar2);
  return;
}

Assistant:

static void namedVariable(Token name, bool canAssign) {
    uint8_t getOp, setOp;
    /**
     * Check if this variable is local first if it is use is
     * else it must be global
     */
    int arg = resolveLocal(current, &name);
    //Check if variable is local
    if (arg != -1) {
        getOp = OP_GET_LOCAL;
        setOp = OP_SET_LOCAL;
    }
    //Check if variable is in local scopes of enclosing functions
    else if ((arg = resolveUpvalue(current, &name)) != -1) {
        getOp = OP_GET_UPVALUE;
        setOp = OP_SET_UPVALUE;
    }
    //Variable now must be global
    else {
        arg = identifierConstant(&name);
        getOp = OP_GET_GLOBAL;
        setOp = OP_SET_GLOBAL;
    }

    if (canAssign && match(TOKEN_EQUAL)) {
        expression();
        emitBytes(setOp, (uint8_t) arg);
    } else {
        emitBytes(getOp, (uint8_t) arg);
    }
}